

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int stb_vorbis_get_samples_float_interleaved
              (stb_vorbis *f,int channels,float *buffer,int num_floats)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  float **outputs;
  float **local_38;
  
  iVar1 = num_floats / channels;
  uVar9 = (ulong)(uint)f->channels;
  if (channels <= f->channels) {
    uVar9 = (ulong)(uint)channels;
  }
  iVar7 = 0;
  while( true ) {
    if (iVar1 - iVar7 == 0 || iVar1 < iVar7) {
      return iVar7;
    }
    iVar3 = f->channel_buffer_start;
    uVar2 = f->channel_buffer_end - iVar3;
    uVar5 = iVar1 - iVar7;
    if ((int)(uVar2 + iVar7) < iVar1) {
      uVar5 = uVar2;
    }
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        if ((int)uVar9 < 1) {
          uVar8 = 0;
        }
        else {
          lVar4 = 0;
          uVar8 = 0;
          do {
            buffer[uVar8] = f->channel_buffers[uVar8][uVar6 + (long)iVar3];
            uVar8 = uVar8 + 1;
            lVar4 = lVar4 + -4;
          } while (uVar9 != uVar8);
          buffer = (float *)((long)buffer - lVar4);
        }
        if ((int)(uint)uVar8 < channels) {
          uVar8 = (ulong)(~(uint)uVar8 + channels);
          memset(buffer,0,uVar8 * 4 + 4);
          buffer = buffer + uVar8 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar5);
    }
    iVar7 = iVar7 + uVar5;
    f->channel_buffer_start = iVar3 + uVar5;
    if (iVar7 == iVar1) break;
    iVar3 = stb_vorbis_get_frame_float(f,(int *)0x0,&local_38);
    if (iVar3 == 0) {
      return iVar7;
    }
  }
  return iVar7;
}

Assistant:

int stb_vorbis_get_samples_float_interleaved(stb_vorbis *f, int channels, float *buffer, int num_floats)
{
   float **outputs;
   int len = num_floats / channels;
   int n=0;
   int z = f->channels;
   if (z > channels) z = channels;
   while (n < len) {
      int i,j;
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      for (j=0; j < k; ++j) {
         for (i=0; i < z; ++i)
            *buffer++ = f->channel_buffers[i][f->channel_buffer_start+j];
         for (   ; i < channels; ++i)
            *buffer++ = 0;
      }
      n += k;
      f->channel_buffer_start += k;
      if (n == len)
         break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs))
         break;
   }
   return n;
}